

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
attach<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>
          (Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *this,
          OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachments)

{
  undefined8 uVar1;
  uint *in_RDX;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> local_40;
  undefined8 local_20;
  
  local_40.tag = *in_RDX;
  if (local_40.tag == 2) {
    local_40.field_1._16_8_ = *(undefined8 *)(in_RDX + 6);
    local_40.field_1._0_8_ = *(undefined8 *)(in_RDX + 2);
    local_40.field_1._8_8_ = *(undefined8 *)(in_RDX + 4);
  }
  else if (local_40.tag == 1) {
    local_40.field_1._0_8_ = *(undefined8 *)(in_RDX + 2);
    local_40.field_1._8_8_ = *(undefined8 *)(in_RDX + 4);
    local_40.field_1._16_8_ = *(undefined8 *)(in_RDX + 6);
    in_RDX[2] = 0;
    in_RDX[3] = 0;
    in_RDX[4] = 0;
    in_RDX[5] = 0;
  }
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>,kj::_::PromiseDisposer,kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)attachments,&local_40);
  uVar1 = local_20;
  local_20 = 0;
  *(undefined8 *)this = uVar1;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::destroy(&local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}